

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

void pgetrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uchar c;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  iVar1 = open(fn,0);
  if (iVar1 < 1) {
    iVar1 = 6;
  }
  else {
    sVar2 = read(iVar1,hd,0x20);
    if (sVar2 == 0x20) {
      if (sx < 1) {
        sx = 0;
      }
      local_40 = (ulong)(uint)sy;
      if (sy < 1) {
        local_40 = 0;
      }
      uVar3 = 0;
      local_48 = (long)r << 2;
      do {
        if (uVar3 == local_40) {
          close(iVar1);
          return;
        }
        local_38 = uVar3;
        for (uVar4 = 0; (uint)sx != uVar4; uVar4 = uVar4 + 1) {
          sVar2 = read(iVar1,&c,1);
          if (sVar2 != 1) {
            iVar1 = 4;
            goto LAB_001027eb;
          }
          bf[uVar4] = (float)c;
        }
        uVar3 = local_38 + 1;
        bf = (float *)((long)bf + local_48);
      } while( true );
    }
    iVar1 = 5;
  }
LAB_001027eb:
  error(iVar1);
}

Assistant:

void pgetrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    if (read(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          if (read(fd,&c,sizeof(c)) != 1) {
            error(4) ;
          }
          bf[r*i + j] = (float)c ;
        }
      }
    }
    else {
      error(5) ;
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}